

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O0

void __thiscall antlr::CharScanner::append(CharScanner *this,char c)

{
  ulong uVar1;
  long in_RDI;
  size_t l;
  undefined1 local_9 [9];
  
  if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
    uVar1 = std::__cxx11::string::length();
    if ((uVar1 & 0xff) == 0) {
      std::__cxx11::string::reserve(in_RDI + 8);
    }
    std::__cxx11::string::replace(in_RDI + 8,uVar1,(char *)0x0,(ulong)local_9);
  }
  return;
}

Assistant:

virtual void append(char c)
	{
		if (saveConsumedInput)
		{
			size_t l = text.length();

			if ((l%256) == 0)
				text.reserve(l+256);

			text.replace(l,0,&c,1);
		}
	}